

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cPipelineStatisticsQueryTests.cpp
# Opt level: O0

void __thiscall
glcts::PipelineStatisticsQueryTestFunctional5::initObjects
          (PipelineStatisticsQueryTestFunctional5 *this)

{
  bool bVar1;
  int iVar2;
  deUint32 err;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  allocator<char> local_41;
  string local_40;
  deUint32 local_20;
  ContextType local_1c;
  long local_18;
  Functions *gl;
  PipelineStatisticsQueryTestFunctional5 *this_local;
  
  gl = (Functions *)this;
  pRVar3 = deqp::Context::getRenderContext
                     ((this->super_PipelineStatisticsQueryTestFunctionalBase).super_TestCase.
                      m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  local_18 = CONCAT44(extraout_var,iVar2);
  pRVar3 = deqp::Context::getRenderContext
                     ((this->super_PipelineStatisticsQueryTestFunctionalBase).super_TestCase.
                      m_context);
  local_1c.super_ApiType.m_bits = (ApiType)(*pRVar3->_vptr_RenderContext[2])();
  local_20 = (deUint32)glu::ApiType::core(4,0);
  bVar1 = glu::contextSupports(local_1c,(ApiType)local_20);
  if (!bVar1) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"OpenGL 4.0+ is required to run this test.",&local_41);
    tcu::NotSupportedError::NotSupportedError(this_00,&local_40);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  PipelineStatisticsQueryTestFunctionalBase::buildProgram
            (&this->super_PipelineStatisticsQueryTestFunctionalBase,(char *)0x0,
             PipelineStatisticsQueryUtilities::dummy_fs_code,(char *)0x0,
             PipelineStatisticsQueryUtilities::dummy_tc_code,
             PipelineStatisticsQueryUtilities::dummy_te_code,
             PipelineStatisticsQueryUtilities::dummy_vs_code);
  (**(code **)(local_18 + 0x1680))((this->super_PipelineStatisticsQueryTestFunctionalBase).m_po_id);
  err = (**(code **)(local_18 + 0x800))();
  glu::checkError(err,"glUseProgram() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cPipelineStatisticsQueryTests.cpp"
                  ,0xed7);
  return;
}

Assistant:

void PipelineStatisticsQueryTestFunctional5::initObjects()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* This test should not execute if we're not running at least a GL4.0 context */
	if (!glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 0)))
	{
		throw tcu::NotSupportedError("OpenGL 4.0+ is required to run this test.");
	}

	buildProgram(DE_NULL,												   /* cs_body */
				 PipelineStatisticsQueryUtilities::dummy_fs_code, DE_NULL, /* gs_body */
				 PipelineStatisticsQueryUtilities::dummy_tc_code, PipelineStatisticsQueryUtilities::dummy_te_code,
				 PipelineStatisticsQueryUtilities::dummy_vs_code);

	gl.useProgram(m_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed.");
}